

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# store.c
# Opt level: O0

void do_cmd_retrieve(command_conflict *cmd)

{
  byte bVar1;
  loc_conflict grid;
  _Bool _Var2;
  wchar_t wVar3;
  store *store_00;
  store *store;
  object *picked_item;
  object *known_obj;
  object *obj;
  command_conflict *pcStack_10;
  wchar_t amt;
  command_conflict *cmd_local;
  
  grid.x = (player->grid).x;
  grid.y = (player->grid).y;
  pcStack_10 = cmd;
  store_00 = store_at((chunk *)cave,grid);
  if (store_00 != (store *)0x0) {
    _Var2 = store_is_home(store_00);
    if (_Var2) {
      wVar3 = cmd_get_arg_item((command *)pcStack_10,"item",&known_obj);
      if (wVar3 == L'\0') {
        _Var2 = pile_contains(store_00->stock,known_obj);
        if (_Var2) {
          wVar3 = cmd_get_arg_number((command *)pcStack_10,"quantity",(int *)((long)&obj + 4));
          if (wVar3 == L'\0') {
            store = (store *)object_new();
            object_copy_amt((object *)store,known_obj,obj._4_4_);
            bVar1 = *(byte *)((long)&store[2].owners + 2);
            wVar3 = inven_carry_num(player,(object *)store);
            if (wVar3 < (int)(uint)bVar1) {
              msg("You cannot carry that many items.");
              object_delete((chunk *)0x0,(chunk *)0x0,(object **)&store);
            }
            else {
              distribute_charges(known_obj,(object *)store,obj._4_4_);
              picked_item = object_new();
              object_copy(picked_item,known_obj->known);
              store->town = (town *)picked_item;
              inven_carry(player,(object *)store,true,true);
              handle_stuff(player);
              store_delete(store_00,known_obj,obj._4_4_);
              event_signal(EVENT_STORECHANGED);
              event_signal(EVENT_INVENTORY);
              event_signal(EVENT_EQUIPMENT);
            }
          }
        }
        else {
          msg("You cannot retrieve that item because it\'s not in the home.");
        }
      }
    }
    else {
      msg("You are not currently at home.");
    }
  }
  return;
}

Assistant:

void do_cmd_retrieve(struct command *cmd)
{
	int amt;

	struct object *obj, *known_obj, *picked_item;

	struct store *store = store_at(cave, player->grid);
	if (!store) return;

	if (!store_is_home(store)) {
		msg("You are not currently at home.");
		return;
	}

	/* Get arguments */
	if (cmd_get_arg_item(cmd, "item", &obj) != CMD_OK)
		return;

	if (!pile_contains(store->stock, obj)) {
		msg("You cannot retrieve that item because it's not in the home.");
		return;
	}

	if (cmd_get_arg_number(cmd, "quantity", &amt) != CMD_OK)
		return;

	/* Get desired object */
	picked_item = object_new();
	object_copy_amt(picked_item, obj, amt);

	/* Ensure we have room */
	if (picked_item->number > inven_carry_num(player, picked_item)) {
		msg("You cannot carry that many items.");
		object_delete(NULL, NULL, &picked_item);
		return;
	}

	/* Distribute charges of wands, staves, or rods */
	distribute_charges(obj, picked_item, amt);

	/* Make a known object */
	known_obj = object_new();
	object_copy(known_obj, obj->known);
	picked_item->known = known_obj;

	/* Give it to the player */
	inven_carry(player, picked_item, true, true);

	/* Handle stuff */
	handle_stuff(player);
	
	/* Reduce or remove the item */
	store_delete(store, obj, amt);

	event_signal(EVENT_STORECHANGED);
	event_signal(EVENT_INVENTORY);
	event_signal(EVENT_EQUIPMENT);
}